

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O0

CategoryMask __thiscall BCLog::Logger::GetCategoryMask(Logger *this)

{
  long lVar1;
  long in_RDI;
  long in_FS_OFFSET;
  memory_order __b;
  __memory_order_modifier in_stack_ffffffffffffffb8;
  memory_order in_stack_ffffffffffffffbc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::operator&(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return *(CategoryMask *)(in_RDI + 0xb0);
}

Assistant:

CategoryMask GetCategoryMask() const { return m_categories.load(); }